

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2sf2rom.cpp
# Opt level: O2

void load_2sf(string *filename,vector<char,_std::allocator<char>_> *rom,int lib_nest_level,
             bool first_load)

{
  char *__name;
  pointer pcVar1;
  vector<char,_std::allocator<char>_> *pvVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  char *pcVar7;
  size_t sVar8;
  string *psVar9;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this;
  size_type sVar10;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  mapped_type *filename_00;
  ssize_t sVar11;
  int *piVar12;
  runtime_error *prVar13;
  ostream *poVar14;
  out_of_range *poVar15;
  pointer pcVar16;
  uint uVar17;
  int iVar18;
  uint32_t load_size;
  string *local_3330;
  int local_3328;
  uint32_t load_offset;
  vector<char,_std::allocator<char>_> *local_3320;
  exception anon_var_0;
  ostringstream message_buffer_2;
  ZlibReader compressed_exe;
  PSFFile psf;
  char absolute_path [4096];
  char pwd [4096];
  char basedir [4096];
  
  local_3328 = lib_nest_level;
  local_3320 = rom;
  if (9 < lib_nest_level) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pwd);
    poVar14 = std::operator<<((ostream *)pwd,(string *)filename);
    poVar14 = std::operator<<(poVar14,": ");
    std::operator<<(poVar14,"Nest level error on psflib loading.");
    poVar15 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::out_of_range::out_of_range(poVar15,(string *)absolute_path);
    __cxa_throw(poVar15,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  getcwd(pwd,0x1000);
  __name = (filename->_M_dataplus)._M_p;
  if (__name == (char *)0x0) {
    piVar12 = __errno_location();
    *piVar12 = 0x16;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)basedir);
    poVar14 = std::operator<<((ostream *)basedir,(string *)filename);
    poVar14 = std::operator<<(poVar14,": ");
    std::operator<<(poVar14,"Unable to determine absolute path.");
    poVar15 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::out_of_range::out_of_range(poVar15,(string *)&message_buffer_2);
    __cxa_throw(poVar15,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  pcVar7 = realpath(__name,absolute_path);
  if (pcVar7 == (char *)0x0) {
    if (*__name == '/') {
      strcpy(absolute_path,__name);
    }
    else {
      getcwd(absolute_path,0x1000);
      sVar8 = strlen(absolute_path);
      (absolute_path + sVar8)[0] = '/';
      (absolute_path + sVar8)[1] = '\0';
      strcat(absolute_path + sVar8 + 1,__name);
    }
  }
  strcpy(basedir,absolute_path);
  dirname(basedir);
  PSFFile::PSFFile(&psf,filename);
  psVar9 = PSFFile::compressed_exe_abi_cxx11_(&psf);
  pcVar1 = (psVar9->_M_dataplus)._M_p;
  psVar9 = PSFFile::compressed_exe_abi_cxx11_(&psf);
  uVar5 = crc32(0,pcVar1,(int)psVar9->_M_string_length);
  uVar6 = PSFFile::compressed_exe_crc32(&psf);
  local_3330 = filename;
  if (uVar6 != uVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&message_buffer_2);
    poVar14 = std::operator<<((ostream *)&message_buffer_2,(string *)local_3330);
    poVar14 = std::operator<<(poVar14,": ");
    std::operator<<(poVar14,"CRC32 error at the compressed program.");
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&compressed_exe);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_3328 = local_3328 + 1;
  iVar18 = 1;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&message_buffer_2);
    std::operator<<((ostream *)&message_buffer_2,"_lib");
    if (1 < iVar18) {
      std::ostream::operator<<((ostream *)&message_buffer_2,iVar18);
    }
    std::__cxx11::stringbuf::str();
    this = &PSFFile::tags_abi_cxx11_(&psf)->_M_h;
    sVar10 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::count(this,(key_type *)&compressed_exe);
    if (sVar10 != 0) {
      chdir(basedir);
      this_00 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)PSFFile::tags_abi_cxx11_(&psf);
      filename_00 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](this_00,(key_type *)&compressed_exe);
      load_2sf(filename_00,local_3320,local_3328,(bool)(first_load & 1));
      chdir(pwd);
      iVar18 = iVar18 + 1;
      first_load = false;
    }
    std::__cxx11::string::~string((string *)&compressed_exe);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&message_buffer_2);
  } while (sVar10 != 0);
  psVar9 = PSFFile::compressed_exe_abi_cxx11_(&psf);
  pcVar1 = (psVar9->_M_dataplus)._M_p;
  psVar9 = PSFFile::compressed_exe_abi_cxx11_(&psf);
  ZlibReader::ZlibReader(&compressed_exe,pcVar1,psVar9->_M_string_length);
  bVar3 = ZlibReader::readInt(&compressed_exe,&load_offset);
  bVar4 = ZlibReader::readInt(&compressed_exe,&load_size);
  pvVar2 = local_3320;
  if (bVar3 && bVar4) {
    uVar17 = load_size + load_offset;
    if (0x8000000 < uVar17) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&message_buffer_2);
      poVar14 = std::operator<<((ostream *)&message_buffer_2,(string *)local_3330);
      poVar14 = std::operator<<(poVar14,": ");
      std::operator<<(poVar14,"Load offset/size of 2SF is too large. ");
      poVar15 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::out_of_range::out_of_range(poVar15,(string *)&anon_var_0);
      __cxa_throw(poVar15,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    if ((first_load & 1U) == 0) {
      pcVar16 = (local_3320->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_3320->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pcVar16) < (ulong)uVar17) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&message_buffer_2);
        poVar14 = std::operator<<((ostream *)&message_buffer_2,(string *)local_3330);
        poVar14 = std::operator<<(poVar14,": ");
        std::operator<<(poVar14,"Load offset/size of 2SF is out of bound.");
        poVar15 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::out_of_range::out_of_range(poVar15,(string *)&anon_var_0);
        __cxa_throw(poVar15,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
    }
    else {
      message_buffer_2 = (ostringstream)0x0;
      std::vector<char,_std::allocator<char>_>::resize
                (local_3320,(ulong)uVar17,(value_type *)&message_buffer_2);
      pcVar16 = (pvVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    sVar11 = ZlibReader::read(&compressed_exe,load_offset + (int)pcVar16,(void *)(ulong)load_size,
                              (ulong)load_offset);
    if ((uint32_t)sVar11 == load_size) {
      ZlibReader::~ZlibReader(&compressed_exe);
      PSFFile::~PSFFile(&psf);
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&message_buffer_2);
    poVar14 = std::operator<<((ostream *)&message_buffer_2,(string *)local_3330);
    poVar14 = std::operator<<(poVar14,": ");
    std::operator<<(poVar14,"Failed to deflate data. Program data is corrupted.");
    poVar15 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::out_of_range::out_of_range(poVar15,(string *)&anon_var_0);
    __cxa_throw(poVar15,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&message_buffer_2);
  poVar14 = std::operator<<((ostream *)&message_buffer_2,(string *)local_3330);
  poVar14 = std::operator<<(poVar14,": ");
  std::operator<<(poVar14,"Unable to read the program header.");
  prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar13,(string *)&anon_var_0);
  __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void load_2sf(const std::string & filename, std::vector<char> & rom, int lib_nest_level = 0, bool first_load = true) {
  // check the psflib nest level
  if (lib_nest_level >= kPSFLibMaxNestLevel) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Nest level error on psflib loading.";
    throw std::out_of_range(message_buffer.str());
  }

  // save the current directory
  char pwd[PATH_MAX];
  getcwd(pwd, PATH_MAX);

  // get the absolute path
  char absolute_path[PATH_MAX];
  if (path_getabspath(filename.c_str(), absolute_path) == NULL) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to determine absolute path.";
    throw std::out_of_range(message_buffer.str());
  }

  // get the directory path
  char basedir[PATH_MAX];
  strcpy(basedir, absolute_path);
  path_dirname(basedir);

  // load the psf file
  PSFFile psf(filename);

  // check CRC32 of the compressed program
  uint32_t actual_crc32 = ::crc32(0L, reinterpret_cast<const Bytef *>(
    psf.compressed_exe().data()), static_cast<uInt>(psf.compressed_exe().size()));
  if (psf.compressed_exe_crc32() != actual_crc32) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "CRC32 error at the compressed program.";
    throw std::runtime_error(message_buffer.str());
  }

  // load psflibs
  int lib_index = 1;
  while (true) {
    // search for _libN tag
    std::ostringstream lib_tag_name_buffer;
    lib_tag_name_buffer << "_lib";
    if (lib_index > 1) {
      lib_tag_name_buffer << lib_index;
    }
    std::string lib_tag_name = lib_tag_name_buffer.str();

    // if no tag is present, end the lib loading
    if (psf.tags().count(lib_tag_name) == 0) {
      break;
    }

    // set the current directory to the parent psf directory
    chdir(basedir);

    // load the lib
    try {
      load_2sf(psf.tags()[lib_tag_name], rom, lib_nest_level + 1, first_load);
    }
    catch (std::exception) {
      chdir(pwd);
      throw;
    }
    chdir(pwd);
    first_load = false;

    // check the next lib
    lib_index++;
  }

  // read the exe header
  // - 4 bytes offset
  // - 4 bytes size
  ZlibReader compressed_exe(psf.compressed_exe().c_str(), psf.compressed_exe().size());
  uint32_t load_offset;
  uint32_t load_size;
  bool read_success = true;
  read_success &= compressed_exe.readInt(load_offset);
  read_success &= compressed_exe.readInt(load_size);
  if (!read_success) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the program header.";
    throw std::runtime_error(message_buffer.str());
  }

  // ensure the rom buffer size
  if (load_offset + load_size > kNDSRomMaxSize) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Load offset/size of 2SF is too large. ";
    throw std::out_of_range(message_buffer.str());
  }
  if (first_load) {
    rom.resize(load_offset + load_size, 0);
  }
  else {
    if (load_offset + load_size > rom.size()) {
      std::ostringstream message_buffer;
      message_buffer << filename << ": " << "Load offset/size of 2SF is out of bound.";
      throw std::out_of_range(message_buffer.str());
    }
  }

  // decompress the program area
  if (compressed_exe.read(&rom[load_offset], load_size) != load_size) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Failed to deflate data. Program data is corrupted.";
    throw std::out_of_range(message_buffer.str());
  }
}